

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::MILSpec::ValueType::MergeFrom(ValueType *this,ValueType *from)

{
  LogMessage *other;
  TensorType *this_00;
  StateType *this_01;
  TupleType *this_02;
  DictionaryType *this_03;
  ListType *this_04;
  undefined1 *puVar1;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/MIL.pb.cc"
               ,0xcd8);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  switch(from->_oneof_case_[0]) {
  case 1:
    this_00 = _internal_mutable_tensortype(this);
    if (from->_oneof_case_[0] == 1) {
      puVar1 = (undefined1 *)(from->type_).tensortype_;
    }
    else {
      puVar1 = _TensorType_default_instance_;
    }
    TensorType::MergeFrom(this_00,(TensorType *)puVar1);
    break;
  case 2:
    this_04 = _internal_mutable_listtype(this);
    if (from->_oneof_case_[0] == 2) {
      puVar1 = (undefined1 *)(from->type_).listtype_;
    }
    else {
      puVar1 = _ListType_default_instance_;
    }
    ListType::MergeFrom(this_04,(ListType *)puVar1);
    break;
  case 3:
    this_02 = _internal_mutable_tupletype(this);
    if (from->_oneof_case_[0] == 3) {
      puVar1 = (undefined1 *)(from->type_).tupletype_;
    }
    else {
      puVar1 = _TupleType_default_instance_;
    }
    TupleType::MergeFrom(this_02,(TupleType *)puVar1);
    break;
  case 4:
    this_03 = _internal_mutable_dictionarytype(this);
    if (from->_oneof_case_[0] == 4) {
      puVar1 = (undefined1 *)(from->type_).dictionarytype_;
    }
    else {
      puVar1 = _DictionaryType_default_instance_;
    }
    DictionaryType::MergeFrom(this_03,(DictionaryType *)puVar1);
    break;
  case 5:
    this_01 = _internal_mutable_statetype(this);
    if (from->_oneof_case_[0] == 5) {
      puVar1 = (undefined1 *)(from->type_).statetype_;
    }
    else {
      puVar1 = _StateType_default_instance_;
    }
    StateType::MergeFrom(this_01,(StateType *)puVar1);
  }
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ValueType::MergeFrom(const ValueType& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.MILSpec.ValueType)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  switch (from.type_case()) {
    case kTensorType: {
      _internal_mutable_tensortype()->::CoreML::Specification::MILSpec::TensorType::MergeFrom(from._internal_tensortype());
      break;
    }
    case kListType: {
      _internal_mutable_listtype()->::CoreML::Specification::MILSpec::ListType::MergeFrom(from._internal_listtype());
      break;
    }
    case kTupleType: {
      _internal_mutable_tupletype()->::CoreML::Specification::MILSpec::TupleType::MergeFrom(from._internal_tupletype());
      break;
    }
    case kDictionaryType: {
      _internal_mutable_dictionarytype()->::CoreML::Specification::MILSpec::DictionaryType::MergeFrom(from._internal_dictionarytype());
      break;
    }
    case kStateType: {
      _internal_mutable_statetype()->::CoreML::Specification::MILSpec::StateType::MergeFrom(from._internal_statetype());
      break;
    }
    case TYPE_NOT_SET: {
      break;
    }
  }
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
}